

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFieldByName(DescriptorPool *this,string_view name)

{
  string_view name_00;
  bool bVar1;
  pointer this_00;
  Symbol local_38;
  FieldDescriptor *local_30;
  FieldDescriptor *field;
  DescriptorPool *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (DescriptorPool *)name._M_len;
  field = (FieldDescriptor *)this;
  this_00 = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->(&this->tables_);
  name_00._M_str = (char *)name_local._M_len;
  name_00._M_len = (size_t)this_local;
  local_38 = Tables::FindByNameHelper(this_00,this,name_00);
  local_30 = Symbol::field_descriptor(&local_38);
  if ((local_30 == (FieldDescriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension(local_30), bVar1)) {
    name_local._M_str = (char *)0x0;
  }
  else {
    name_local._M_str = (char *)local_30;
  }
  return (FieldDescriptor *)name_local._M_str;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindFieldByName(
    absl::string_view name) const {
  if (const FieldDescriptor* field =
          tables_->FindByNameHelper(this, name).field_descriptor()) {
    if (!field->is_extension()) {
      return field;
    }
  }
  return nullptr;
}